

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateFieldAccessorTableInitializer
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldGeneratorInfo *pFVar1;
  Descriptor *pDVar2;
  OneofGeneratorInfo *pOVar3;
  Descriptor *in_RDX;
  long lVar4;
  long lVar5;
  int iVar6;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_70,(java *)(this->super_MessageGenerator).descriptor_,in_RDX);
  local_50.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_50._M_string_length = 2;
  local_50.field_2._M_local_buf[2] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  io::Printer::Print<char[11],std::__cxx11::string,char[4],std::__cxx11::string>
            (printer,
             "internal_$identifier$_fieldAccessorTable = new\n  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n    internal_$identifier$_descriptor,\n    new java.lang.String[] { "
             ,(char (*) [11])0x28f9fa,&local_70,(char (*) [4])0x2d0ec3,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (*(int *)(pDVar2 + 0x68) < 1) {
    iVar6 = 10;
  }
  else {
    iVar6 = 10;
    lVar4 = 0;
    lVar5 = 0;
    do {
      pFVar1 = Context::GetFieldGeneratorInfo
                         (this->context_,(FieldDescriptor *)(*(long *)(pDVar2 + 0x28) + lVar4));
      iVar6 = iVar6 + 6;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"\"$field_name$\", ",(char (*) [11])0x2b53d2,&pFVar1->capitalized_name);
      lVar5 = lVar5 + 1;
      pDVar2 = (this->super_MessageGenerator).descriptor_;
      lVar4 = lVar4 + 0x98;
    } while (lVar5 < *(int *)(pDVar2 + 0x68));
  }
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar2 + 0x6c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pOVar3 = Context::GetOneofGeneratorInfo
                         (this->context_,(OneofDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar4));
      iVar6 = iVar6 + 6;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,"\"$oneof_name$\", ",(char (*) [11])0x291bd9,&pOVar3->capitalized_name);
      lVar5 = lVar5 + 1;
      pDVar2 = (this->super_MessageGenerator).descriptor_;
      lVar4 = lVar4 + 0x30;
    } while (lVar5 < *(int *)(pDVar2 + 0x6c));
  }
  io::Printer::Print<>(printer,"});\n");
  return iVar6;
}

Assistant:

int ImmutableMessageGenerator::GenerateFieldAccessorTableInitializer(
    io::Printer* printer) {
  int bytecode_estimate = 10;
  printer->Print(
      "internal_$identifier$_fieldAccessorTable = new\n"
      "  com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable(\n"
      "    internal_$identifier$_descriptor,\n"
      "    new java.lang.String[] { ",
      "identifier", UniqueFileScopeIdentifier(descriptor_), "ver",
      GeneratedCodeVersionSuffix());
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
    bytecode_estimate += 6;
    printer->Print("\"$field_name$\", ", "field_name", info->capitalized_name);
  }
  // We reproduce synthetic oneofs here since proto reflection needs these.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    const OneofGeneratorInfo* info = context_->GetOneofGeneratorInfo(oneof);
    bytecode_estimate += 6;
    printer->Print("\"$oneof_name$\", ", "oneof_name", info->capitalized_name);
  }
  printer->Print("});\n");
  return bytecode_estimate;
}